

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::anon_unknown_0::LdexpCaseInstance::getInputValues
          (LdexpCaseInstance *this,int numValues,void **values)

{
  float fVar1;
  pointer pSVar2;
  deUint32 dVar3;
  uint uVar4;
  int iVar5;
  Float<unsigned_int,_8,_23,_127,_3U> FVar6;
  undefined4 extraout_var;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int caseNdx;
  uint uVar10;
  long lVar11;
  int iVar12;
  undefined4 in_register_00000034;
  bool bVar13;
  float fVar14;
  undefined1 extraout_var_00 [12];
  undefined1 auVar15 [16];
  int in1;
  float in0;
  undefined8 local_80;
  ulong local_78;
  ulong local_70;
  void **local_68;
  int local_60;
  float local_5c;
  Random rnd;
  float local_48 [6];
  
  local_78 = CONCAT44(in_register_00000034,numValues);
  local_48[0] = -2.0;
  local_48[1] = 2.0;
  local_48[2] = -1000.0;
  local_48[3] = 1000.0;
  local_48[4] = -1e+07;
  local_48[5] = 1e+07;
  local_68 = values;
  dVar3 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&rnd.m_rnd,dVar3 ^ 0x2790a);
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  uVar4 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  local_80 = CONCAT44(extraout_var,uVar4);
  iVar9 = 0;
  local_70 = 0;
  if (0 < (int)uVar4) {
    local_70 = (ulong)uVar4;
  }
  for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
    frexp((anon_unknown_0 *)&in0,(double)(ulong)(uint)(&DAT_009cf1f0)[lVar11],&in1);
    uVar8 = local_70;
    iVar7 = iVar9;
    while (bVar13 = uVar8 != 0, uVar8 = uVar8 - 1, bVar13) {
      *(float *)((long)*local_68 + (long)iVar7 * 4) = in0;
      *(int *)((long)local_68[1] + (long)iVar7 * 4) = in1;
      iVar7 = iVar7 + 1;
    }
    iVar9 = iVar9 + (int)local_80;
  }
  iVar7 = (int)local_78 + -8;
  iVar9 = 0;
  if (0 < iVar7) {
    iVar9 = iVar7;
  }
  iVar7 = 0x3a;
  if (uVar10 != 2) {
    iVar7 = iVar9 + 8;
  }
  iVar5 = (int)local_80 * 8;
  iVar9 = 8;
  while( true ) {
    uVar8 = local_70;
    local_60 = iVar5;
    if (iVar9 == iVar7) break;
    while (bVar13 = uVar8 != 0, uVar8 = uVar8 - 1, bVar13) {
      fVar1 = local_48[(ulong)uVar10 * 2];
      local_5c = local_48[(ulong)uVar10 * 2 + 1] - fVar1;
      fVar14 = deRandom_getFloat(&rnd.m_rnd);
      auVar15._0_4_ = fVar14 * local_5c + fVar1;
      auVar15._4_12_ = extraout_var_00;
      frexp((anon_unknown_0 *)&in0,auVar15._0_8_,&in1);
      *(float *)((long)*local_68 + (long)iVar5 * 4) = in0;
      *(int *)((long)local_68[1] + (long)iVar5 * 4) = in1;
      iVar5 = iVar5 + 1;
    }
    iVar9 = iVar9 + 1;
    iVar5 = local_60 + (int)local_80;
  }
  local_78 = (ulong)(uint)((int)local_78 - iVar7);
  iVar7 = iVar7 * (int)local_80;
  iVar9 = 0;
  while( true ) {
    uVar8 = local_70;
    iVar5 = iVar7;
    if ((int)local_78 <= iVar9) break;
    while( true ) {
      bVar13 = uVar8 == 0;
      uVar8 = uVar8 - 1;
      if (bVar13) break;
      dVar3 = deRandom_getUint32(&rnd.m_rnd);
      uVar10 = dVar3 % 0xfe;
      bVar13 = de::Random::getBool((Random *)&rnd.m_rnd);
      dVar3 = deRandom_getUint32(&rnd.m_rnd);
      iVar12 = -uVar10;
      if (iVar12 < -0x7d) {
        iVar12 = -0x7e;
      }
      uVar4 = 0xfd - uVar10;
      if (0x7e < uVar4) {
        uVar4 = 0x7f;
      }
      iVar12 = de::Random::getInt((Random *)&rnd.m_rnd,iVar12,uVar4);
      FVar6 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct
                        (-(uint)bVar13 | 1,uVar10 - 0x7e,dVar3 & 0x7fffff | 0x800000);
      ldexp((double)(ulong)FVar6.m_value,iVar12);
      *(StorageType *)((long)*local_68 + (long)iVar5 * 4) = FVar6.m_value;
      *(int *)((long)local_68[1] + (long)iVar5 * 4) = iVar12;
      iVar5 = iVar5 + 1;
    }
    iVar9 = iVar9 + 1;
    iVar7 = iVar7 + (int)local_80;
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd					(deStringHash(m_name) ^ 0x2790au);
		const glu::DataType		type				= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision			= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize			= glu::getDataTypeScalarSize(type);
		int						valueNdx			= 0;

		{
			const float easySpecialCases[] = { 0.0f, -0.0f, 0.5f, -0.5f, 1.0f, -1.0f, 2.0f, -2.0f };

			DE_ASSERT(valueNdx + DE_LENGTH_OF_ARRAY(easySpecialCases) <= numValues);
			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(easySpecialCases); caseNdx++)
			{
				float	in0;
				int		in1;

				frexp(easySpecialCases[caseNdx], &in0, &in1);

				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}

		{
			// \note lowp and mediump can not necessarily fit the values in hard cases, so we'll use only easy ones.
			const int numEasyRandomCases = precision == glu::PRECISION_HIGHP ? 50 : (numValues-valueNdx);

			DE_ASSERT(valueNdx + numEasyRandomCases <= numValues);
			for (int caseNdx = 0; caseNdx < numEasyRandomCases; caseNdx++)
			{
				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					const float	in	= rnd.getFloat(ranges[precision].x(), ranges[precision].y());
					float		in0;
					int			in1;

					frexp(in, &in0, &in1);

					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}

		{
			const int numHardRandomCases = numValues-valueNdx;
			DE_ASSERT(numHardRandomCases >= 0 && valueNdx + numHardRandomCases <= numValues);

			for (int caseNdx = 0; caseNdx < numHardRandomCases; caseNdx++)
			{
				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					const int		fpExp		= rnd.getInt(-126, 127);
					const int		sign		= rnd.getBool() ? -1 : +1;
					const deUint32	mantissa	= (1u<<23) | (rnd.getUint32() & ((1u<<23)-1));
					const int		in1			= rnd.getInt(de::max(-126, -126-fpExp), de::min(127, 127-fpExp));
					const float		in0			= tcu::Float32::construct(sign, fpExp, mantissa).asFloat();

					DE_ASSERT(de::inRange(in1, -126, 127)); // See Khronos bug 11180
					DE_ASSERT(de::inRange(in1+fpExp, -126, 127));

					const float		out			= ldexp(in0, in1);

					DE_ASSERT(!tcu::Float32(out).isInf() && !tcu::Float32(out).isDenorm());
					DE_UNREF(out);

					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}
	}